

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

bool __thiscall
Js::JavascriptArray::ArrayElementEnumerator::MoveNext<int>(ArrayElementEnumerator *this)

{
  SparseArraySegmentBase *pSVar1;
  uint uVar2;
  uint32 uVar3;
  uint uVar4;
  
  pSVar1 = this->seg;
  uVar3 = this->index;
  uVar2 = this->endIndex;
  do {
    if (pSVar1 == (SparseArraySegmentBase *)0x0) {
      return false;
    }
    while( true ) {
      uVar3 = uVar3 + 1;
      this->index = uVar3;
      if (uVar2 <= uVar3) break;
      if ((&pSVar1[1].left)[uVar3] != 0xfff80002) {
        return true;
      }
    }
    pSVar1 = (pSVar1->next).ptr;
    this->seg = pSVar1;
    if (pSVar1 != (SparseArraySegmentBase *)0x0) {
      uVar4 = this->end - pSVar1->left;
      if (this->end < pSVar1->left || uVar4 == 0) {
        this->seg = (SparseArraySegmentBase *)0x0;
        return false;
      }
      this->index = 0xffffffff;
      uVar2 = pSVar1->length;
      if (uVar4 < pSVar1->length) {
        uVar2 = uVar4;
      }
      this->endIndex = uVar2;
      uVar3 = 0xffffffff;
    }
  } while( true );
}

Assistant:

inline bool JavascriptArray::ArrayElementEnumerator::MoveNext()
    {
        while (seg)
        {
            // Look for next non-null item in current segment
            while (++index < endIndex)
            {
                if (!SparseArraySegment<T>::IsMissingItem(&((SparseArraySegment<T>*)seg)->elements[index]))
                {
                    return true;
                }
            }

            // Move to next segment
            seg = seg->next;
            if (seg)
            {
                if (seg->left >= end)
                {
                    seg = nullptr;
                    break;
                }
                else
                {
                    index = static_cast<uint32>(-1);
                    endIndex = min(end - seg->left, seg->length);
                }
            }
        }

        return false;
    }